

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltable.c
# Opt level: O2

Node * mainposition(Table *t,TValue *key)

{
  Node *pNVar1;
  uint uVar2;
  undefined8 in_RAX;
  ulong uVar3;
  double dVar4;
  int i;
  
  i = (int)((ulong)in_RAX >> 0x20);
  uVar2 = key->tt_ & 0x3f;
  pNVar1 = t->node;
  switch(uVar2) {
  case 1:
switchD_0011d530_caseD_1:
    uVar3 = (ulong)(uint)(~(-1 << (t->lsizenode & 0x1f)) & (key->value_).b);
    break;
  case 3:
    dVar4 = frexp((key->value_).n,&i);
    dVar4 = dVar4 * 2147483648.0;
    uVar2 = 0;
    if ((-9.223372036854776e+18 <= dVar4) && (uVar2 = 0, dVar4 < 9.223372036854776e+18)) {
      uVar2 = (int)(long)dVar4 + i;
      uVar2 = (int)uVar2 >> 0x1f ^ uVar2;
    }
    uVar3 = (ulong)((int)uVar2 % (int)(~(-1 << (t->lsizenode & 0x1f)) | 1U));
    break;
  case 4:
    uVar3 = (ulong)(~(-1 << (t->lsizenode & 0x1f)) & *(uint *)((key->value_).f + 0xc));
    break;
  default:
    if (uVar2 != 0x16) {
      if (uVar2 == 0x14) {
        uVar2 = luaS_hashlongstr((TString *)(key->value_).gc);
        uVar3 = (ulong)(~(-1 << (t->lsizenode & 0x1f)) & uVar2);
        break;
      }
      if (uVar2 == 0x13) goto switchD_0011d530_caseD_1;
    }
  case 2:
    uVar3 = (ulong)(uint)(key->value_).b % (ulong)(~(-1 << (t->lsizenode & 0x1f)) | 1);
  }
  return pNVar1 + uVar3;
}

Assistant:

static Node *mainposition (const Table *t, const TValue *key) {
  switch (ttype(key)) {
    case LUA_TNUMINT:
      return hashint(t, ivalue(key));
    case LUA_TNUMFLT:
      return hashmod(t, l_hashfloat(fltvalue(key)));
    case LUA_TSHRSTR:
      return hashstr(t, tsvalue(key));
    case LUA_TLNGSTR:
      return hashpow2(t, luaS_hashlongstr(tsvalue(key)));
    case LUA_TBOOLEAN:
      return hashboolean(t, bvalue(key));
    case LUA_TLIGHTUSERDATA:
      return hashpointer(t, pvalue(key));
    case LUA_TLCF:
      return hashpointer(t, fvalue(key));
    default:
      lua_assert(!ttisdeadkey(key));
      return hashpointer(t, gcvalue(key));
  }
}